

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  ~IfcFooting((IfcFooting *)&this[-1].field_0x58);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}